

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

AssertionResult __thiscall
(anonymous_namespace)::AnyWriteChecker::operator()
          (AnyWriteChecker *this,char *param_2,unsigned_long *value)

{
  bool bVar1;
  AssertionResult *in_RDX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult *in_RSI;
  undefined8 in_RDI;
  AssertionResult AVar2;
  AssertionResult result;
  char *in_stack_000002b0;
  unsigned_long *in_stack_000002b8;
  char *in_stack_00000890;
  unsigned_long *in_stack_00000898;
  AssertionResult local_30;
  
  check_write<char,unsigned_long>(in_stack_000002b8,in_stack_000002b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (bVar1) {
    check_write<wchar_t,unsigned_long>(in_stack_00000898,in_stack_00000890);
  }
  else {
    testing::AssertionResult::AssertionResult(in_RSI,in_RDX);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a212);
  AVar2.message_.ptr_ = extraout_RDX.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

::testing::AssertionResult operator()(const char *, const T &value) const {
    ::testing::AssertionResult result = check_write<char>(value, "char");
    return result ? check_write<wchar_t>(value, "wchar_t") : result;
  }